

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O0

void __thiscall CMenus::SetMenuPage(CMenus *this,int NewPage)

{
  CConfig *pCVar1;
  CCamera *this_00;
  int in_ESI;
  long in_RDI;
  int CameraPos;
  int in_stack_ffffffffffffffdc;
  int local_10;
  
  if (in_ESI != *(int *)(in_RDI + 0x1c)) {
    *(int *)(in_RDI + 0x1c) = in_ESI;
    local_10 = -1;
    this_00 = (CCamera *)(ulong)(*(int *)(in_RDI + 0x1c) - 5);
    switch(this_00) {
    case (CCamera *)0x0:
      local_10 = 1;
      break;
    case (CCamera *)0x1:
      local_10 = 2;
      break;
    case (CCamera *)0x2:
      local_10 = 3;
      break;
    case (CCamera *)0x3:
      pCVar1 = CComponent::Config((CComponent *)0x171a93);
      local_10 = pCVar1->m_UiSettingsPage + 4;
      break;
    case (CCamera *)0x5:
      local_10 = 0;
    }
    if (((local_10 != -1) && (*(long *)(in_RDI + 8) != 0)) &&
       (*(long *)(*(long *)(in_RDI + 8) + 0x1b1f0) != 0)) {
      CCamera::ChangePosition(this_00,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void CMenus::SetMenuPage(int NewPage)
{
	if(NewPage == m_MenuPage)
		return;

	m_MenuPage = NewPage;

	// update camera position
	{
		int CameraPos = -1;

		switch(m_MenuPage)
		{
		case PAGE_START: CameraPos = CCamera::POS_START; break;
		case PAGE_DEMOS: CameraPos = CCamera::POS_DEMOS; break;
		case PAGE_SETTINGS: CameraPos = CCamera::POS_SETTINGS_GENERAL+Config()->m_UiSettingsPage; break;
		case PAGE_INTERNET: CameraPos = CCamera::POS_INTERNET; break;
		case PAGE_LAN: CameraPos = CCamera::POS_LAN;
		}

		if(CameraPos != -1 && m_pClient && m_pClient->m_pCamera)
			m_pClient->m_pCamera->ChangePosition(CameraPos);
	}
}